

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * lua_upvalueid(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  ulong uVar2;
  undefined8 local_28;
  GCfunc *fn;
  int n_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  uVar2 = pTVar1->u64 & 0x7fffffffffff;
  if (*(char *)(uVar2 + 10) == '\0') {
    local_28 = *(void **)(uVar2 + 0x28 + (long)(n + -1) * 8);
  }
  else {
    local_28 = (void *)(uVar2 + 0x30 + (long)(n + -1) * 8);
  }
  return local_28;
}

Assistant:

LUA_API void *lua_upvalueid(lua_State *L, int idx, int n)
{
  GCfunc *fn = funcV(index2adr(L, idx));
  n--;
  lj_checkapi((uint32_t)n < fn->l.nupvalues, "bad upvalue %d", n);
  return isluafunc(fn) ? (void *)gcref(fn->l.uvptr[n]) :
			 (void *)&fn->c.upvalue[n];
}